

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

float __thiscall Rml::Element::GetScrollHeight(Element *this)

{
  float b;
  float fVar1;
  Element *this_local;
  
  fVar1 = (this->scrollable_overflow_rectangle).y;
  b = GetClientHeight(this);
  fVar1 = Math::Max<float>(fVar1,b);
  return fVar1;
}

Assistant:

float Element::GetScrollHeight()
{
	return Math::Max(scrollable_overflow_rectangle.y, GetClientHeight());
}